

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2_smt.c
# Opt level: O0

MPP_RET rc_model_v2_smt_check_reenc(void *ctx,EncRcTask *task)

{
  int iVar1;
  MPP_RET MVar2;
  EncFrmStatus *pEVar3;
  int local_48;
  uint local_44;
  RK_S32 bits_thr;
  MppEncRcDropFrmMode drop_mode;
  RcCfg *usr_cfg;
  EncFrmStatus *frm;
  EncRcTaskInfo *cfg;
  RcModelV2SmtCtx *p;
  EncRcTask *task_local;
  void *ctx_local;
  
  pEVar3 = &task->frm;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","enter ctx %p cfg %p\n","rc_model_v2_smt_check_reenc",ctx,
               &task->info);
  }
  pEVar3->val = pEVar3->val & 0xfffffffbffffffff;
  if (*(int *)((long)ctx + 8) == 2) {
    return MPP_OK;
  }
  if (((task->force).force_flag & 1) != 0) {
    return MPP_OK;
  }
  if (*(int *)((long)ctx + 0x2a4) == 0) {
    if (*(int *)((long)ctx + 0x2a8) != 0) {
      return MPP_OK;
    }
    MVar2 = check_re_enc_smt((RcModelV2SmtCtx *)ctx,&task->info);
    if (MVar2 == MPP_OK) {
      return MPP_OK;
    }
    local_44 = *(uint *)((long)ctx + 0xac);
    if ((pEVar3->val >> 4 & 1) != 0) {
      local_44 = 0;
    }
    if ((*(int *)((long)ctx + 0xb4) != 0) &&
       (*(uint *)((long)ctx + 0xb4) <= *(uint *)((long)ctx + 0x2a0))) {
      local_44 = 0;
    }
    if ((rc_debug & 0x200) != 0) {
      _mpp_log_l(4,"rc_model_v2_smt","reenc drop_mode %d drop_cnt %d\n",(char *)0x0,(ulong)local_44,
                 (ulong)*(uint *)((long)ctx + 0x2a0));
    }
    if (local_44 != 0) {
      if (local_44 == 1) {
        pEVar3->val = pEVar3->val & 0xfffffffeffffffff | 0x100000000;
        pEVar3->val = pEVar3->val & 0xfffffffbffffffff | 0x400000000;
        *(undefined4 *)((long)ctx + 0x2a4) = 1;
        *(int *)((long)ctx + 0x2a0) = *(int *)((long)ctx + 0x2a0) + 1;
        if ((rc_debug & 0x200) == 0) {
          return MPP_OK;
        }
        _mpp_log_l(4,"rc_model_v2_smt","drop\n",(char *)0x0);
        return MPP_OK;
      }
      if (local_44 == 2) {
        pEVar3->val = pEVar3->val & 0xffffffefffffffff | 0x1000000000;
        pEVar3->val = pEVar3->val & 0xfffffffbffffffff | 0x400000000;
        *(undefined4 *)((long)ctx + 0x2a8) = 1;
        *(int *)((long)ctx + 0x2a0) = *(int *)((long)ctx + 0x2a0) + 1;
        if ((rc_debug & 0x200) == 0) {
          return MPP_OK;
        }
        _mpp_log_l(4,"rc_model_v2_smt","force_pskip\n",(char *)0x0);
        return MPP_OK;
      }
    }
    local_48 = *(int *)((long)ctx + 0xc0);
    if (*(int *)((long)ctx + 0x104) == 2) {
      local_48 = *(int *)((long)ctx + 0xbc);
    }
    iVar1 = (task->info).bit_real;
    if (iVar1 == local_48 * 2 || SBORROW4(iVar1,local_48 * 2) != iVar1 + local_48 * -2 < 0) {
      if ((local_48 * 3) / 2 < (task->info).bit_real) {
        (task->info).quality_target = (task->info).quality_target + 2;
      }
      else if (local_48 < (task->info).bit_real) {
        (task->info).quality_target = (task->info).quality_target + 1;
      }
    }
    else {
      (task->info).quality_target = (task->info).quality_target + 3;
    }
    if ((task->info).quality_target < (task->info).quality_max) {
      *(int *)((long)ctx + 0x29c) = *(int *)((long)ctx + 0x29c) + 1;
      pEVar3->val = pEVar3->val & 0xfffffffbffffffff | 0x400000000;
    }
    *(undefined4 *)((long)ctx + 0x2a0) = 0;
    return MPP_OK;
  }
  return MPP_OK;
}

Assistant:

MPP_RET rc_model_v2_smt_check_reenc(void *ctx, EncRcTask *task)
{
    RcModelV2SmtCtx *p = (RcModelV2SmtCtx *)ctx;
    EncRcTaskInfo *cfg = (EncRcTaskInfo *)&task->info;
    EncFrmStatus *frm = &task->frm;
    RcCfg *usr_cfg = &p->usr_cfg;

    rc_dbg_func("enter ctx %p cfg %p\n", ctx, cfg);

    frm->reencode = 0;

    if ((usr_cfg->mode == RC_FIXQP) ||
        (task->force.force_flag & ENC_RC_FORCE_QP) ||
        p->on_drop || p->on_pskip)
        return MPP_OK;

    if (check_re_enc_smt(p, cfg)) {
        MppEncRcDropFrmMode drop_mode = usr_cfg->drop_mode;

        if (frm->is_intra)
            drop_mode = MPP_ENC_RC_DROP_FRM_DISABLED;

        if (usr_cfg->drop_gap && p->drop_cnt >= usr_cfg->drop_gap)
            drop_mode = MPP_ENC_RC_DROP_FRM_DISABLED;

        rc_dbg_drop("reenc drop_mode %d drop_cnt %d\n", drop_mode, p->drop_cnt);

        switch (drop_mode) {
        case MPP_ENC_RC_DROP_FRM_NORMAL : {
            frm->drop = 1;
            frm->reencode = 1;
            p->on_drop = 1;
            p->drop_cnt++;
            rc_dbg_drop("drop\n");
        } break;
        case MPP_ENC_RC_DROP_FRM_PSKIP : {
            frm->force_pskip = 1;
            frm->reencode = 1;
            p->on_pskip = 1;
            p->drop_cnt++;
            rc_dbg_drop("force_pskip\n");
        } break;
        case MPP_ENC_RC_DROP_FRM_DISABLED :
        default : {
            RK_S32 bits_thr = usr_cfg->super_cfg.super_p_thd;
            if (p->frame_type == INTRA_FRAME)
                bits_thr = usr_cfg->super_cfg.super_i_thd;

            if (cfg->bit_real > bits_thr * 2)
                cfg->quality_target += 3;
            else if (cfg->bit_real > bits_thr * 3 / 2)
                cfg->quality_target += 2;
            else if (cfg->bit_real > bits_thr)
                cfg->quality_target ++;

            if (cfg->quality_target < cfg->quality_max) {
                p->reenc_cnt++;
                frm->reencode = 1;
            }
            p->drop_cnt = 0;
        } break;
        }
    }

    return MPP_OK;
}